

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

int Gia_ManFindOneUnate(word **pSets,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t **vUnateLits,
                       Vec_Int_t **vNotUnateVars,int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint local_38;
  int n;
  int fVerbose_local;
  Vec_Int_t **vNotUnateVars_local;
  Vec_Int_t **vUnateLits_local;
  int nWords_local;
  Vec_Ptr_t *vDivs_local;
  word **pSets_local;
  
  if (fVerbose != 0) {
    printf("  ");
  }
  for (local_38 = 0; (int)local_38 < 2; local_38 = local_38 + 1) {
    Gia_ManFindOneUnateInt
              (pSets[(int)local_38],pSets[(int)(uint)((local_38 != 0 ^ 0xffU) & 1)],vDivs,nWords,
               vUnateLits[(int)local_38],vNotUnateVars[(int)local_38]);
    if (fVerbose != 0) {
      uVar1 = Vec_IntSize(vUnateLits[(int)local_38]);
      printf("U%d =%4d ",(ulong)local_38,(ulong)uVar1);
    }
  }
  iVar2 = Gia_ManFindFirstCommonLit(*vUnateLits,vUnateLits[1],fVerbose);
  return iVar2;
}

Assistant:

int Gia_ManFindOneUnate( word * pSets[2], Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnateLits[2], Vec_Int_t * vNotUnateVars[2], int fVerbose )
{
    int n;
    if ( fVerbose ) printf( "  " );
    for ( n = 0; n < 2; n++ )
    {
        Gia_ManFindOneUnateInt( pSets[n], pSets[!n], vDivs, nWords, vUnateLits[n], vNotUnateVars[n] );
        if ( fVerbose ) printf( "U%d =%4d ", n, Vec_IntSize(vUnateLits[n]) );
    }
    return Gia_ManFindFirstCommonLit( vUnateLits[0], vUnateLits[1], fVerbose );
}